

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StressTest.cpp
# Opt level: O3

void __thiscall StressTester::CreateTreeHelper(StressTester *this,TestObject *root,int depth)

{
  int iVar1;
  size_t extraBytes;
  TestObject *root_00;
  int iVar2;
  long lVar3;
  int iVar4;
  Recycler *this_00;
  Recycler *recycler;
  TestObject **data;
  ulong uVar5;
  
  if (root->pointerCount < 1) {
    return;
  }
  uVar5 = (ulong)((long)&root[2].size + 7U) & 0xffffffffffffffe0;
  iVar2 = this->treeTotal;
  iVar4 = 0;
  this_00 = (Recycler *)this;
LAB_0075179f:
  recycler = this->recycler;
  if ((depth == 0) || (1000 < iVar2)) {
    iVar2 = PAL_rand();
    root_00 = TestObject::Create(recycler,0,(long)iVar2,LeafObj);
    iVar1 = root->pointerCount;
    if (0 < (long)iVar1) {
      lVar3 = 0;
      do {
        if (*(long *)(uVar5 + lVar3 * 8) == 0) goto LAB_0075182a;
        lVar3 = lVar3 + 1;
      } while (iVar1 != lVar3);
    }
  }
  else {
    extraBytes = GetRandomSize((StressTester *)this_00);
    root_00 = TestObject::Create(recycler,4,extraBytes,NormalObj);
    recycler = (Recycler *)this;
    CreateTreeHelper(this,root_00,depth + -1);
    iVar1 = root->pointerCount;
    if (0 < (long)iVar1) {
      lVar3 = 0;
      do {
        if (*(long *)(uVar5 + lVar3 * 8) == 0) goto LAB_0075182a;
        lVar3 = lVar3 + 1;
      } while (iVar1 != lVar3);
    }
  }
  goto LAB_0075182e;
LAB_0075182a:
  *(TestObject **)(uVar5 + lVar3 * 8) = root_00;
LAB_0075182e:
  iVar4 = iVar4 + 1;
  iVar2 = this->treeTotal + 1;
  this->treeTotal = iVar2;
  this_00 = recycler;
  if (iVar1 <= iVar4) {
    return;
  }
  goto LAB_0075179f;
}

Assistant:

void StressTester::CreateTreeHelper(TestObject *root, int depth) {
    for (int i = 0; i < root->pointerCount; ++i, ++treeTotal)
    {
        if (depth == 0 || treeTotal > MaxNodesInTree)
        {
            root->Add(TestObject::Create(recycler, 0, rand(), LeafObj));
        }
        else
        {
            TestObject *newObj = TestObject::Create(recycler, 4, GetRandomSize());
            CreateTreeHelper(newObj, depth - 1);
            root->Add(newObj);
        }
    }
}